

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_64x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  unkuint9 Var32;
  undefined1 auVar33 [11];
  undefined1 auVar34 [13];
  undefined1 auVar35 [15];
  unkuint9 Var36;
  undefined1 auVar37 [11];
  undefined1 auVar38 [15];
  unkuint9 Var39;
  undefined1 auVar40 [11];
  undefined1 auVar41 [13];
  undefined1 auVar42 [15];
  unkuint9 Var43;
  undefined1 auVar44 [11];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  int y_mask;
  uint uVar53;
  uint8_t *puVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar57;
  ushort uVar58;
  short sVar59;
  short sVar60;
  ushort uVar61;
  short sVar62;
  short sVar63;
  ushort uVar65;
  short sVar66;
  undefined1 auVar64 [16];
  short sVar67;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  undefined1 auVar68 [16];
  short sVar80;
  short sVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  short sVar97;
  ushort uVar98;
  ushort uVar99;
  undefined1 auVar85 [16];
  short sVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  
  auVar56 = _DAT_0046ed80;
  auVar55 = pshuflw(ZEXT116(left_column[0xf]),ZEXT116(left_column[0xf]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar3 = *(undefined1 (*) [16])(top_row + 0x20);
  auVar4 = *(undefined1 (*) [16])(top_row + 0x30);
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar1._0_13_;
  auVar8[0xe] = auVar1[7];
  auVar12[0xc] = auVar1[6];
  auVar12._0_12_ = auVar1._0_12_;
  auVar12._13_2_ = auVar8._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar1._0_11_;
  auVar16._12_3_ = auVar12._12_3_;
  auVar20[10] = auVar1[5];
  auVar20._0_10_ = auVar1._0_10_;
  auVar20._11_4_ = auVar16._11_4_;
  auVar24[9] = 0;
  auVar24._0_9_ = auVar1._0_9_;
  auVar24._10_5_ = auVar20._10_5_;
  auVar28[8] = auVar1[4];
  auVar28._0_8_ = auVar1._0_8_;
  auVar28._9_6_ = auVar24._9_6_;
  auVar31._7_8_ = 0;
  auVar31._0_7_ = auVar28._8_7_;
  Var32 = CONCAT81(SUB158(auVar31 << 0x40,7),auVar1[3]);
  auVar45._9_6_ = 0;
  auVar45._0_9_ = Var32;
  auVar33._1_10_ = SUB1510(auVar45 << 0x30,5);
  auVar33[0] = auVar1[2];
  auVar46._11_4_ = 0;
  auVar46._0_11_ = auVar33;
  auVar34._1_12_ = SUB1512(auVar46 << 0x20,3);
  auVar34[0] = auVar1[1];
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar2._0_13_;
  auVar5[0xe] = auVar2[7];
  auVar9[0xc] = auVar2[6];
  auVar9._0_12_ = auVar2._0_12_;
  auVar9._13_2_ = auVar5._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar2._0_11_;
  auVar13._12_3_ = auVar9._12_3_;
  auVar17[10] = auVar2[5];
  auVar17._0_10_ = auVar2._0_10_;
  auVar17._11_4_ = auVar13._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar2._0_9_;
  auVar21._10_5_ = auVar17._10_5_;
  auVar25[8] = auVar2[4];
  auVar25._0_8_ = auVar2._0_8_;
  auVar25._9_6_ = auVar21._9_6_;
  auVar35._7_8_ = 0;
  auVar35._0_7_ = auVar25._8_7_;
  Var36 = CONCAT81(SUB158(auVar35 << 0x40,7),auVar2[3]);
  auVar47._9_6_ = 0;
  auVar47._0_9_ = Var36;
  auVar37._1_10_ = SUB1510(auVar47 << 0x30,5);
  auVar37[0] = auVar2[2];
  auVar48._11_4_ = 0;
  auVar48._0_11_ = auVar37;
  auVar29[2] = auVar2[1];
  auVar29._0_2_ = auVar2._0_2_;
  auVar29._3_12_ = SUB1512(auVar48 << 0x20,3);
  uVar58 = auVar2._0_2_ & 0xff;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar3._0_13_;
  auVar6[0xe] = auVar3[7];
  auVar10[0xc] = auVar3[6];
  auVar10._0_12_ = auVar3._0_12_;
  auVar10._13_2_ = auVar6._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar3._0_11_;
  auVar14._12_3_ = auVar10._12_3_;
  auVar18[10] = auVar3[5];
  auVar18._0_10_ = auVar3._0_10_;
  auVar18._11_4_ = auVar14._11_4_;
  auVar22[9] = 0;
  auVar22._0_9_ = auVar3._0_9_;
  auVar22._10_5_ = auVar18._10_5_;
  auVar26[8] = auVar3[4];
  auVar26._0_8_ = auVar3._0_8_;
  auVar26._9_6_ = auVar22._9_6_;
  auVar38._7_8_ = 0;
  auVar38._0_7_ = auVar26._8_7_;
  Var39 = CONCAT81(SUB158(auVar38 << 0x40,7),auVar3[3]);
  auVar49._9_6_ = 0;
  auVar49._0_9_ = Var39;
  auVar40._1_10_ = SUB1510(auVar49 << 0x30,5);
  auVar40[0] = auVar3[2];
  auVar50._11_4_ = 0;
  auVar50._0_11_ = auVar40;
  auVar41._1_12_ = SUB1512(auVar50 << 0x20,3);
  auVar41[0] = auVar3[1];
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar4._0_13_;
  auVar7[0xe] = auVar4[7];
  auVar11[0xc] = auVar4[6];
  auVar11._0_12_ = auVar4._0_12_;
  auVar11._13_2_ = auVar7._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar4._0_11_;
  auVar15._12_3_ = auVar11._12_3_;
  auVar19[10] = auVar4[5];
  auVar19._0_10_ = auVar4._0_10_;
  auVar19._11_4_ = auVar15._11_4_;
  auVar23[9] = 0;
  auVar23._0_9_ = auVar4._0_9_;
  auVar23._10_5_ = auVar19._10_5_;
  auVar27[8] = auVar4[4];
  auVar27._0_8_ = auVar4._0_8_;
  auVar27._9_6_ = auVar23._9_6_;
  auVar42._7_8_ = 0;
  auVar42._0_7_ = auVar27._8_7_;
  Var43 = CONCAT81(SUB158(auVar42 << 0x40,7),auVar4[3]);
  auVar51._9_6_ = 0;
  auVar51._0_9_ = Var43;
  auVar44._1_10_ = SUB1510(auVar51 << 0x30,5);
  auVar44[0] = auVar4[2];
  auVar52._11_4_ = 0;
  auVar52._0_11_ = auVar44;
  auVar30[2] = auVar4[1];
  auVar30._0_2_ = auVar4._0_2_;
  auVar30._3_12_ = SUB1512(auVar52 << 0x20,3);
  uVar61 = auVar4._0_2_ & 0xff;
  sVar63 = auVar55._0_2_;
  sVar66 = auVar55._2_2_;
  auVar55._2_2_ = sVar66 * 0x1f;
  auVar55._0_2_ = sVar63;
  auVar55._4_2_ = sVar63 * 0x3c;
  auVar55._6_2_ = sVar66 * 0x56;
  auVar55._8_2_ = sVar63 * 0x6f;
  auVar55._10_2_ = sVar66 * 0x85;
  auVar55._12_2_ = sVar63 * 0x9a;
  auVar55._14_2_ = sVar66 * 0xac;
  puVar54 = dst + 0x30;
  uVar53 = 0x1000100;
  while( true ) {
    auVar64 = _DAT_0046eda0;
    sVar57 = (short)Var32;
    uVar83 = auVar8._13_2_ >> 8;
    sVar59 = (short)Var36;
    uVar84 = auVar5._13_2_ >> 8;
    sVar60 = (short)Var39;
    uVar88 = auVar6._13_2_ >> 8;
    sVar62 = (short)Var43;
    uVar65 = auVar7._13_2_ >> 8;
    if (0xf0e0f0e < uVar53) break;
    auVar85._4_4_ = uVar53;
    auVar85._0_4_ = uVar53;
    auVar85._8_4_ = uVar53;
    auVar85._12_4_ = uVar53;
    auVar64 = pshufb(auVar56,auVar85);
    auVar68 = pshufb(auVar55,auVar85);
    sVar71 = auVar64._0_2_;
    sVar73 = auVar64._2_2_;
    sVar75 = auVar64._4_2_;
    sVar77 = auVar64._6_2_;
    sVar79 = auVar64._8_2_;
    sVar81 = auVar64._10_2_;
    sVar97 = auVar64._12_2_;
    sVar100 = auVar64._14_2_;
    sVar67 = auVar68._0_2_ + 0x80;
    sVar69 = auVar68._2_2_ + 0x80;
    sVar70 = auVar68._4_2_ + 0x80;
    sVar72 = auVar68._6_2_ + 0x80;
    sVar74 = auVar68._8_2_ + 0x80;
    sVar76 = auVar68._10_2_ + 0x80;
    sVar78 = auVar68._12_2_ + 0x80;
    sVar80 = auVar68._14_2_ + 0x80;
    uVar82 = sVar71 * (ushort)auVar1[0] + sVar67;
    uVar86 = sVar73 * auVar34._0_2_ + sVar69;
    uVar89 = sVar75 * auVar33._0_2_ + sVar70;
    uVar91 = sVar77 * sVar57 + sVar72;
    uVar93 = sVar79 * auVar28._8_2_ + sVar74;
    uVar95 = sVar81 * auVar20._10_2_ + sVar76;
    uVar98 = sVar97 * auVar12._12_2_ + sVar78;
    uVar101 = sVar100 * uVar83 + sVar80;
    uVar83 = uVar82 >> 8;
    uVar87 = uVar86 >> 8;
    uVar90 = uVar89 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar99 = uVar98 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = sVar71 * (ushort)auVar1[8] + sVar67;
    uVar106 = sVar73 * (ushort)auVar1[9] + sVar69;
    uVar108 = sVar75 * (ushort)auVar1[10] + sVar70;
    uVar110 = sVar77 * (ushort)auVar1[0xb] + sVar72;
    uVar112 = sVar79 * (ushort)auVar1[0xc] + sVar74;
    uVar114 = sVar81 * (ushort)auVar1[0xd] + sVar76;
    uVar116 = sVar97 * (ushort)auVar1[0xe] + sVar78;
    uVar118 = sVar100 * (ushort)auVar1[0xf] + sVar80;
    uVar105 = uVar104 >> 8;
    uVar107 = uVar106 >> 8;
    uVar109 = uVar108 >> 8;
    uVar111 = uVar110 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    uVar119 = uVar118 >> 8;
    puVar54[-0x30] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    puVar54[-0x2f] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar54[-0x2e] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar54[-0x2d] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar54[-0x2c] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar54[-0x2b] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar54[-0x2a] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar54[-0x29] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar54[-0x28] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar54[-0x27] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar54[-0x26] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar109);
    puVar54[-0x25] = (uVar111 != 0) * (uVar111 < 0x100) * (char)(uVar110 >> 8) - (0xff < uVar111);
    puVar54[-0x24] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar54[-0x23] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar54[-0x22] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar54[-0x21] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    uVar83 = sVar71 * uVar58 + sVar67;
    uVar82 = sVar73 * auVar29._2_2_ + sVar69;
    uVar87 = sVar75 * auVar37._0_2_ + sVar70;
    uVar90 = sVar77 * sVar59 + sVar72;
    uVar92 = sVar79 * auVar25._8_2_ + sVar74;
    uVar94 = sVar81 * auVar17._10_2_ + sVar76;
    uVar96 = sVar97 * auVar9._12_2_ + sVar78;
    uVar99 = sVar100 * uVar84 + sVar80;
    uVar84 = uVar83 >> 8;
    uVar86 = uVar82 >> 8;
    uVar89 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar98 = uVar96 >> 8;
    uVar101 = uVar99 >> 8;
    uVar102 = sVar71 * (ushort)auVar2[8] + sVar67;
    uVar105 = sVar73 * (ushort)auVar2[9] + sVar69;
    uVar107 = sVar75 * (ushort)auVar2[10] + sVar70;
    uVar109 = sVar77 * (ushort)auVar2[0xb] + sVar72;
    uVar111 = sVar79 * (ushort)auVar2[0xc] + sVar74;
    uVar113 = sVar81 * (ushort)auVar2[0xd] + sVar76;
    uVar115 = sVar97 * (ushort)auVar2[0xe] + sVar78;
    uVar117 = sVar100 * (ushort)auVar2[0xf] + sVar80;
    uVar104 = uVar102 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    puVar54[-0x20] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar54[-0x1f] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar86);
    puVar54[-0x1e] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
    puVar54[-0x1d] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar54[-0x1c] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar54[-0x1b] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar54[-0x1a] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar98);
    puVar54[-0x19] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar54[-0x18] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar104);
    puVar54[-0x17] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar54[-0x16] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar54[-0x15] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar54[-0x14] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar54[-0x13] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar54[-0x12] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar54[-0x11] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    uVar83 = sVar71 * (ushort)auVar3[0] + sVar67;
    uVar82 = sVar73 * auVar41._0_2_ + sVar69;
    uVar86 = sVar75 * auVar40._0_2_ + sVar70;
    uVar89 = sVar77 * sVar60 + sVar72;
    uVar91 = sVar79 * auVar26._8_2_ + sVar74;
    uVar93 = sVar81 * auVar18._10_2_ + sVar76;
    uVar95 = sVar97 * auVar10._12_2_ + sVar78;
    uVar98 = sVar100 * uVar88 + sVar80;
    uVar84 = uVar83 >> 8;
    uVar88 = uVar82 >> 8;
    uVar87 = uVar86 >> 8;
    uVar90 = uVar89 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar99 = uVar98 >> 8;
    uVar101 = sVar71 * (ushort)auVar3[8] + sVar67;
    uVar104 = sVar73 * (ushort)auVar3[9] + sVar69;
    uVar106 = sVar75 * (ushort)auVar3[10] + sVar70;
    uVar108 = sVar77 * (ushort)auVar3[0xb] + sVar72;
    uVar110 = sVar79 * (ushort)auVar3[0xc] + sVar74;
    uVar112 = sVar81 * (ushort)auVar3[0xd] + sVar76;
    uVar114 = sVar97 * (ushort)auVar3[0xe] + sVar78;
    uVar116 = sVar100 * (ushort)auVar3[0xf] + sVar80;
    uVar102 = uVar101 >> 8;
    uVar105 = uVar104 >> 8;
    uVar107 = uVar106 >> 8;
    uVar109 = uVar108 >> 8;
    uVar111 = uVar110 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    puVar54[-0x10] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar54[-0xf] = (uVar88 != 0) * (uVar88 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar88);
    puVar54[-0xe] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    puVar54[-0xd] = (uVar90 != 0) * (uVar90 < 0x100) * (char)(uVar89 >> 8) - (0xff < uVar90);
    puVar54[-0xc] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar54[-0xb] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar54[-10] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar54[-9] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar54[-8] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar54[-7] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar54[-6] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar54[-5] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar109);
    puVar54[-4] = (uVar111 != 0) * (uVar111 < 0x100) * (char)(uVar110 >> 8) - (0xff < uVar111);
    puVar54[-3] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar54[-2] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar54[-1] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    uVar99 = sVar71 * uVar61 + sVar67;
    uVar102 = sVar73 * auVar30._2_2_ + sVar69;
    uVar105 = sVar75 * auVar44._0_2_ + sVar70;
    uVar107 = sVar77 * sVar62 + sVar72;
    uVar109 = sVar79 * auVar27._8_2_ + sVar74;
    uVar111 = sVar81 * auVar19._10_2_ + sVar76;
    uVar113 = sVar97 * auVar11._12_2_ + sVar78;
    uVar115 = sVar100 * uVar65 + sVar80;
    uVar101 = uVar99 >> 8;
    uVar104 = uVar102 >> 8;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar83 = sVar71 * (ushort)auVar4[8] + sVar67;
    uVar88 = sVar73 * (ushort)auVar4[9] + sVar69;
    uVar82 = sVar75 * (ushort)auVar4[10] + sVar70;
    uVar87 = sVar77 * (ushort)auVar4[0xb] + sVar72;
    uVar90 = sVar79 * (ushort)auVar4[0xc] + sVar74;
    uVar92 = sVar81 * (ushort)auVar4[0xd] + sVar76;
    uVar94 = sVar97 * (ushort)auVar4[0xe] + sVar78;
    uVar96 = sVar100 * (ushort)auVar4[0xf] + sVar80;
    uVar84 = uVar83 >> 8;
    uVar65 = uVar88 >> 8;
    uVar86 = uVar82 >> 8;
    uVar89 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar98 = uVar96 >> 8;
    *puVar54 = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar54[1] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar104);
    puVar54[2] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar54[3] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar54[4] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar54[5] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar54[6] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar54[7] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar54[8] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
    puVar54[9] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar65);
    puVar54[10] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar86);
    puVar54[0xb] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
    puVar54[0xc] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar54[0xd] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar54[0xe] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar54[0xf] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar98);
    uVar53 = uVar53 + 0x2020202;
    puVar54 = puVar54 + stride;
  }
  auVar56._0_2_ = sVar63 * 0xbc;
  auVar56._2_2_ = sVar66 * 0xca;
  auVar56._4_2_ = sVar63 * 0xd5;
  auVar56._6_2_ = sVar66 * 0xdf;
  auVar56._8_2_ = sVar63 * 0xe6;
  auVar56._10_2_ = sVar66 * 0xec;
  auVar56._12_2_ = sVar63 * 0xef;
  auVar56._14_2_ = sVar66 * 0xf0;
  for (uVar53 = 0x1000100; uVar53 < 0xf0e0f0f; uVar53 = uVar53 + 0x2020202) {
    auVar68._4_4_ = uVar53;
    auVar68._0_4_ = uVar53;
    auVar68._8_4_ = uVar53;
    auVar68._12_4_ = uVar53;
    auVar55 = pshufb(auVar64,auVar68);
    auVar68 = pshufb(auVar56,auVar68);
    sVar78 = auVar55._0_2_;
    sVar80 = auVar55._2_2_;
    sVar71 = auVar55._4_2_;
    sVar73 = auVar55._6_2_;
    sVar75 = auVar55._8_2_;
    sVar77 = auVar55._10_2_;
    sVar79 = auVar55._12_2_;
    sVar81 = auVar55._14_2_;
    sVar63 = auVar68._0_2_ + 0x80;
    sVar66 = auVar68._2_2_ + 0x80;
    sVar67 = auVar68._4_2_ + 0x80;
    sVar69 = auVar68._6_2_ + 0x80;
    sVar70 = auVar68._8_2_ + 0x80;
    sVar72 = auVar68._10_2_ + 0x80;
    sVar74 = auVar68._12_2_ + 0x80;
    sVar76 = auVar68._14_2_ + 0x80;
    uVar82 = sVar78 * (ushort)auVar1[0] + sVar63;
    uVar87 = sVar80 * auVar34._0_2_ + sVar66;
    uVar90 = sVar71 * auVar33._0_2_ + sVar67;
    uVar92 = sVar73 * sVar57 + sVar69;
    uVar94 = sVar75 * auVar28._8_2_ + sVar70;
    uVar96 = sVar77 * auVar20._10_2_ + sVar72;
    uVar99 = sVar79 * auVar12._12_2_ + sVar74;
    uVar102 = sVar81 * uVar83 + sVar76;
    uVar86 = uVar82 >> 8;
    uVar89 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar98 = uVar96 >> 8;
    uVar101 = uVar99 >> 8;
    uVar104 = uVar102 >> 8;
    uVar105 = sVar78 * (ushort)auVar1[8] + sVar63;
    uVar107 = sVar80 * (ushort)auVar1[9] + sVar66;
    uVar109 = sVar71 * (ushort)auVar1[10] + sVar67;
    uVar111 = sVar73 * (ushort)auVar1[0xb] + sVar69;
    uVar113 = sVar75 * (ushort)auVar1[0xc] + sVar70;
    uVar115 = sVar77 * (ushort)auVar1[0xd] + sVar72;
    uVar117 = sVar79 * (ushort)auVar1[0xe] + sVar74;
    uVar119 = sVar81 * (ushort)auVar1[0xf] + sVar76;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar103 = uVar119 >> 8;
    puVar54[-0x30] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar86);
    puVar54[-0x2f] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
    puVar54[-0x2e] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar54[-0x2d] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar54[-0x2c] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar54[-0x2b] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar98);
    puVar54[-0x2a] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar54[-0x29] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar104);
    puVar54[-0x28] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar54[-0x27] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar54[-0x26] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar54[-0x25] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar54[-0x24] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar54[-0x23] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar54[-0x22] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar54[-0x21] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar103);
    uVar82 = sVar78 * uVar58 + sVar63;
    uVar87 = sVar80 * auVar29._2_2_ + sVar66;
    uVar90 = sVar71 * auVar37._0_2_ + sVar67;
    uVar92 = sVar73 * sVar59 + sVar69;
    uVar94 = sVar75 * auVar25._8_2_ + sVar70;
    uVar96 = sVar77 * auVar17._10_2_ + sVar72;
    uVar99 = sVar79 * auVar9._12_2_ + sVar74;
    uVar102 = sVar81 * uVar84 + sVar76;
    uVar86 = uVar82 >> 8;
    uVar89 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar98 = uVar96 >> 8;
    uVar101 = uVar99 >> 8;
    uVar104 = uVar102 >> 8;
    uVar105 = sVar78 * (ushort)auVar2[8] + sVar63;
    uVar107 = sVar80 * (ushort)auVar2[9] + sVar66;
    uVar109 = sVar71 * (ushort)auVar2[10] + sVar67;
    uVar111 = sVar73 * (ushort)auVar2[0xb] + sVar69;
    uVar113 = sVar75 * (ushort)auVar2[0xc] + sVar70;
    uVar115 = sVar77 * (ushort)auVar2[0xd] + sVar72;
    uVar117 = sVar79 * (ushort)auVar2[0xe] + sVar74;
    uVar119 = sVar81 * (ushort)auVar2[0xf] + sVar76;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar103 = uVar119 >> 8;
    puVar54[-0x20] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar86);
    puVar54[-0x1f] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
    puVar54[-0x1e] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar54[-0x1d] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar54[-0x1c] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar54[-0x1b] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar98);
    puVar54[-0x1a] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar54[-0x19] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar104);
    puVar54[-0x18] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar54[-0x17] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar54[-0x16] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar54[-0x15] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar54[-0x14] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar54[-0x13] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar54[-0x12] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar54[-0x11] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar103);
    uVar82 = sVar78 * (ushort)auVar3[0] + sVar63;
    uVar87 = sVar80 * auVar41._0_2_ + sVar66;
    uVar90 = sVar71 * auVar40._0_2_ + sVar67;
    uVar92 = sVar73 * sVar60 + sVar69;
    uVar94 = sVar75 * auVar26._8_2_ + sVar70;
    uVar96 = sVar77 * auVar18._10_2_ + sVar72;
    uVar99 = sVar79 * auVar10._12_2_ + sVar74;
    uVar102 = sVar81 * uVar88 + sVar76;
    uVar86 = uVar82 >> 8;
    uVar89 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar98 = uVar96 >> 8;
    uVar101 = uVar99 >> 8;
    uVar104 = uVar102 >> 8;
    uVar105 = sVar78 * (ushort)auVar3[8] + sVar63;
    uVar107 = sVar80 * (ushort)auVar3[9] + sVar66;
    uVar109 = sVar71 * (ushort)auVar3[10] + sVar67;
    uVar111 = sVar73 * (ushort)auVar3[0xb] + sVar69;
    uVar113 = sVar75 * (ushort)auVar3[0xc] + sVar70;
    uVar115 = sVar77 * (ushort)auVar3[0xd] + sVar72;
    uVar117 = sVar79 * (ushort)auVar3[0xe] + sVar74;
    uVar119 = sVar81 * (ushort)auVar3[0xf] + sVar76;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar103 = uVar119 >> 8;
    puVar54[-0x10] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar86);
    puVar54[-0xf] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
    puVar54[-0xe] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar54[-0xd] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar54[-0xc] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar54[-0xb] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar98);
    puVar54[-10] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar54[-9] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar104);
    puVar54[-8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar54[-7] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar54[-6] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar54[-5] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar54[-4] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar54[-3] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar54[-2] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar54[-1] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar103);
    uVar105 = sVar78 * uVar61 + sVar63;
    uVar107 = sVar80 * auVar30._2_2_ + sVar66;
    uVar109 = sVar71 * auVar44._0_2_ + sVar67;
    uVar111 = sVar73 * sVar62 + sVar69;
    uVar113 = sVar75 * auVar27._8_2_ + sVar70;
    uVar115 = sVar77 * auVar19._10_2_ + sVar72;
    uVar117 = sVar79 * auVar11._12_2_ + sVar74;
    uVar119 = sVar81 * uVar65 + sVar76;
    uVar106 = uVar105 >> 8;
    uVar108 = uVar107 >> 8;
    uVar110 = uVar109 >> 8;
    uVar112 = uVar111 >> 8;
    uVar114 = uVar113 >> 8;
    uVar116 = uVar115 >> 8;
    uVar118 = uVar117 >> 8;
    uVar103 = uVar119 >> 8;
    uVar82 = sVar78 * (ushort)auVar4[8] + sVar63;
    uVar87 = sVar80 * (ushort)auVar4[9] + sVar66;
    uVar90 = sVar71 * (ushort)auVar4[10] + sVar67;
    uVar92 = sVar73 * (ushort)auVar4[0xb] + sVar69;
    uVar94 = sVar75 * (ushort)auVar4[0xc] + sVar70;
    uVar96 = sVar77 * (ushort)auVar4[0xd] + sVar72;
    uVar99 = sVar79 * (ushort)auVar4[0xe] + sVar74;
    uVar102 = sVar81 * (ushort)auVar4[0xf] + sVar76;
    uVar86 = uVar82 >> 8;
    uVar89 = uVar87 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar98 = uVar96 >> 8;
    uVar101 = uVar99 >> 8;
    uVar104 = uVar102 >> 8;
    *puVar54 = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar106);
    puVar54[1] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar54[2] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar110);
    puVar54[3] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar54[4] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar114);
    puVar54[5] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar54[6] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar54[7] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar119 >> 8) - (0xff < uVar103);
    puVar54[8] = (uVar86 != 0) * (uVar86 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar86);
    puVar54[9] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar87 >> 8) - (0xff < uVar89);
    puVar54[10] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar54[0xb] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar54[0xc] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar54[0xd] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar98);
    puVar54[0xe] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar54[0xf] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar104);
    puVar54 = puVar54 + stride;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_64x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[15]);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top_lolo = LoadUnaligned16(top_row);
  const __m128i top_lohi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lolo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lolo, zero);
  const __m128i top3 = cvtepu8_epi16(top_lohi);
  const __m128i top4 = _mm_unpackhi_epi8(top_lohi, zero);

  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = _mm_unpackhi_epi8(weights, zero);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i top_hilo = LoadUnaligned16(top_row + 32);
  const __m128i top_hihi = LoadUnaligned16(top_row + 48);
  const __m128i top5 = cvtepu8_epi16(top_hilo);
  const __m128i top6 = _mm_unpackhi_epi8(top_hilo, zero);
  const __m128i top7 = cvtepu8_epi16(top_hihi);
  const __m128i top8 = _mm_unpackhi_epi8(top_hihi, zero);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}